

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_derive.cpp
# Opt level: O0

void derive_functions::derkeng
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  int in_EDX;
  long in_RSI;
  long in_R8;
  Array4<double> der;
  Array4<const_double> in_dat;
  undefined1 local_378 [64];
  anon_class_128_2_b7d7e273 *in_stack_fffffffffffffcc8;
  Box *in_stack_fffffffffffffcd0;
  Array4<double> local_2f8;
  Array4<const_double> local_2b8;
  int local_25c;
  long local_258;
  Array4<double> local_240;
  int local_1fc;
  long local_1f8;
  Dim3 local_1f0;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  double *local_1a8;
  Dim3 local_1a0;
  undefined8 *local_190;
  undefined4 local_184;
  undefined4 uStack_180;
  int local_17c;
  Dim3 local_178;
  undefined8 *local_168;
  int local_160;
  int iStack_15c;
  int local_158;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  Dim3 local_f8;
  Dim3 local_e4;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined4 uStack_88;
  int local_84;
  Dim3 local_80;
  undefined8 *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_1a8 = *(double **)(in_R8 + 0x10);
  local_1b0 = (undefined8 *)(in_R8 + 0x18);
  local_1b4 = *(int *)(in_R8 + 0x34);
  local_104 = 0;
  local_184 = *(undefined4 *)local_1b0;
  local_114 = 1;
  uStack_180 = *(undefined4 *)(in_R8 + 0x1c);
  local_1d0._0_8_ = *local_1b0;
  local_124 = 2;
  local_1d0.z = *(int *)(in_R8 + 0x20);
  local_130 = (int *)(in_R8 + 0x24);
  local_134 = 0;
  local_160 = *local_130 + 1;
  local_140 = in_R8 + 0x24;
  local_144 = 1;
  iStack_15c = *(int *)(in_R8 + 0x28) + 1;
  local_150 = in_R8 + 0x24;
  local_154 = 2;
  local_1f0.z = *(int *)(in_R8 + 0x2c) + 1;
  local_1f0.y = iStack_15c;
  local_1f0.x = local_160;
  local_25c = in_EDX;
  local_258 = in_RSI;
  local_1e0._0_8_ = local_1f0._0_8_;
  local_1e0.z = local_1f0.z;
  local_1c0._0_8_ = local_1d0._0_8_;
  local_1c0.z = local_1d0.z;
  local_1a0._0_8_ = local_1d0._0_8_;
  local_1a0.z = local_1d0.z;
  local_190 = local_1b0;
  local_17c = local_1d0.z;
  local_178._0_8_ = local_1f0._0_8_;
  local_178.z = local_1f0.z;
  local_168 = local_1b0;
  local_158 = local_1f0.z;
  local_120 = local_1b0;
  local_110 = local_1b0;
  local_100 = local_1b0;
  amrex::Array4<const_double>::Array4(&local_2b8,local_1a8,&local_1c0,&local_1e0,local_1b4);
  local_1f8 = local_258;
  local_1fc = local_25c;
  local_b0 = *(double **)(local_258 + 0x10);
  local_b8 = (undefined8 *)(local_258 + 0x18);
  local_bc = *(int *)(local_258 + 0x34);
  local_c = 0;
  local_8c = *(undefined4 *)local_b8;
  local_1c = 1;
  uStack_88 = *(undefined4 *)(local_258 + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_2c = 2;
  local_d8.z = *(int *)(local_258 + 0x20);
  local_38 = (int *)(local_258 + 0x24);
  local_3c = 0;
  local_68 = *local_38 + 1;
  local_48 = local_258 + 0x24;
  local_4c = 1;
  iStack_64 = *(int *)(local_258 + 0x28) + 1;
  local_58 = local_258 + 0x24;
  local_5c = 2;
  local_f8.z = *(int *)(local_258 + 0x2c) + 1;
  local_f8.y = iStack_64;
  local_f8.x = local_68;
  local_e4._0_8_ = local_f8._0_8_;
  local_e4.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_84 = local_d8.z;
  local_80._0_8_ = local_f8._0_8_;
  local_80.z = local_f8.z;
  local_70 = local_b8;
  local_60 = local_f8.z;
  local_28 = local_b8;
  local_18 = local_b8;
  local_8 = local_b8;
  amrex::Array4<double>::Array4(&local_240,local_b0,&local_c8,&local_e4,local_bc);
  amrex::Array4<double>::Array4<double,_0>(&local_2f8,&local_240,local_1fc);
  memcpy(local_378,&local_2b8,0x3c);
  memcpy(&stack0xfffffffffffffcc8,&local_2f8,0x3c);
  amrex::
  ParallelFor<derive_functions::derkeng(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__0>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  return;
}

Assistant:

void derkeng (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
		const FArrayBox& datfab, const Geometry& /*geomdata*/,
		Real /*time*/, const int* /*bcrec*/, int /*level*/)

  {
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 1);
    AMREX_ASSERT(ncomp == 1);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);

    amrex::ParallelFor(bx,[=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
      const Real rho = in_dat(i,j,k,0);
      const Real vx  = in_dat(i,j,k,1);
      const Real vy  = in_dat(i,j,k,2);
#if (AMREX_SPACEDIM ==3)
      const Real vz  = in_dat(i,j,k,3);
#endif

      der(i,j,k) =  0.5 * rho * ( vx*vx + vy*vy
#if (AMREX_SPACEDIM == 3 )
				  + vz*vz
#endif
				  );
    });
  }